

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O1

void __thiscall
iutest::detail::IParamTestSuiteInfo::IParamTestSuiteInfo
          (IParamTestSuiteInfo *this,string *base_name,string *package_name)

{
  pointer pcVar1;
  
  this->_vptr_IParamTestSuiteInfo = (_func_int **)&PTR__IParamTestSuiteInfo_003a3300;
  (this->m_testinfos).
  super__Vector_base<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testinfos).
  super__Vector_base<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testinfos).
  super__Vector_base<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_testsuite_base_name)._M_dataplus._M_p = (pointer)&(this->m_testsuite_base_name).field_2;
  pcVar1 = (base_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_testsuite_base_name,pcVar1,pcVar1 + base_name->_M_string_length);
  (this->m_package_name)._M_dataplus._M_p = (pointer)&(this->m_package_name).field_2;
  pcVar1 = (package_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_package_name,pcVar1,pcVar1 + package_name->_M_string_length);
  return;
}

Assistant:

IParamTestSuiteInfo(const char* base_name, const char* package_name)
        : m_testsuite_base_name(base_name), m_package_name(package_name) {}